

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::BasicReporter::NoAssertionsInTestCase(BasicReporter *this,string *testName)

{
  ostream *poVar1;
  Colour colour;
  Colour local_11;
  
  startSpansLazily(this);
  Colour::Colour(&local_11,BrightRed);
  poVar1 = (this->m_config).m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\nNo assertions in test case, \'",0x1e)
  ;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(testName->_M_dataplus)._M_p,testName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'\n",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  Colour::~Colour(&local_11);
  return;
}

Assistant:

virtual void NoAssertionsInTestCase( const std::string& testName ) {
            startSpansLazily();
            Colour colour( Colour::ResultError );
            m_config.stream() << "\nNo assertions in test case, '" << testName << "'\n" << std::endl;
        }